

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

DataBuffer * __thiscall BotscriptParser::currentBuffer(BotscriptParser *this)

{
  if (this->m_switchBuffer != (DataBuffer *)0x0) {
    return this->m_switchBuffer;
  }
  if (this->m_currentMode != Onenter) {
    if (this->m_currentMode == MainLoop) {
      return this->m_mainLoopBuffer;
    }
    return this->m_mainBuffer;
  }
  return this->m_onenterBuffer;
}

Assistant:

DataBuffer* BotscriptParser::currentBuffer()
{
	if (m_switchBuffer != nullptr)
		return m_switchBuffer;

	if (m_currentMode == ParserMode::MainLoop)
		return m_mainLoopBuffer;

	if (m_currentMode == ParserMode::Onenter)
		return m_onenterBuffer;

	return m_mainBuffer;
}